

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<TPZFlopCounter>::Subst_Forward
          (TPZMatrix<TPZFlopCounter> *this,TPZFMatrix<TPZFlopCounter> *B)

{
  TPZFlopCounter *pTVar1;
  int64_t iVar2;
  long lVar3;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  int64_t i;
  TPZFlopCounter sum;
  int64_t c;
  TPZFlopCounter pivot;
  int64_t r;
  TPZBaseMatrix *in_stack_ffffffffffffff50;
  TPZFlopCounter *in_stack_ffffffffffffff58;
  REAL local_68 [2];
  undefined8 local_58;
  TPZFlopCounter local_50;
  long local_48;
  double local_40;
  TPZFlopCounter local_38;
  long local_30;
  undefined8 local_28;
  TPZFlopCounter *local_20;
  TPZBaseMatrix *local_18;
  int local_4;
  
  local_18 = in_RSI;
  iVar2 = TPZBaseMatrix::Rows(in_RSI);
  lVar3 = (**(code **)(*in_RDI + 0x60))();
  if (((iVar2 == lVar3) && ((char)in_RDI[3] != '\0')) && ((char)in_RDI[3] == '\x03')) {
    local_20 = (TPZFlopCounter *)0x0;
    while( true ) {
      pTVar1 = local_20;
      lVar3 = (**(code **)(*in_RDI + 0x60))();
      if (lVar3 <= (long)pTVar1) break;
      local_28 = (**(code **)(*in_RDI + 0x120))(in_RDI,local_20,local_20);
      local_30 = 0;
      while( true ) {
        lVar3 = local_30;
        iVar2 = TPZBaseMatrix::Cols(local_18);
        if (iVar2 <= lVar3) break;
        local_40 = 0.0;
        TPZFlopCounter::TPZFlopCounter(&local_38,&local_40);
        for (local_48 = 0; lVar3 = local_30, local_48 < (long)local_20; local_48 = local_48 + 1) {
          local_58 = (**(code **)(*in_RDI + 0x120))(in_RDI,local_20,local_48);
          (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(local_18,local_48,local_30);
          local_50 = TPZFlopCounter::operator*
                               (in_stack_ffffffffffffff58,
                                (TPZFlopCounter *)in_stack_ffffffffffffff50);
          TPZFlopCounter::operator+=(&local_38,&local_50);
        }
        in_stack_ffffffffffffff50 = local_18;
        in_stack_ffffffffffffff58 = local_20;
        (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(local_18,local_20,local_30);
        TPZFlopCounter::operator-
                  (in_stack_ffffffffffffff58,(TPZFlopCounter *)in_stack_ffffffffffffff50);
        local_68[0] = (REAL)TPZFlopCounter::operator/
                                      (in_stack_ffffffffffffff58,
                                       (TPZFlopCounter *)in_stack_ffffffffffffff50);
        (*(in_stack_ffffffffffffff50->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,lVar3,local_68);
        local_30 = local_30 + 1;
      }
      local_20 = (TPZFlopCounter *)((long)&local_20->fVal + 1);
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky)
		return( 0 );
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols();  c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
			//
			TVar sum = 0.0;
			for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
			// Faz B[r,c] = (B[r,c] - sum) / A[r,r].
			//
			B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
		}
	}
	return( 1 );
}